

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreIncTestInt32(void)

{
  bool expected;
  int t;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 8; lVar2 != 0x74; lVar2 = lVar2 + 0xc) {
    t = *(int *)(&UNK_0015ab88 + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
             operator++(&si);
    expected = *(bool *)((long)&inc_int32 + lVar2);
    if ((pSVar1->m_int == *(int *)(&UNK_0015ab8c + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case inc_int32 throw (1): ",&local_51);
      err_msg<int>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreIncTestInt32()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int32_t > si(inc_int32[i].x);
			SafeInt< std::int32_t > vv = ++si;

			if(vv != inc_int32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int32[i].fExpected )
		{
			err_msg( "Error in case inc_int32 throw (1): ", inc_int32[i].x, inc_int32[i].fExpected );
		}
	}
}